

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O1

Matrix3d * ins_ekf::RPYToRotMat(Matrix3d *__return_storage_ptr__,Vector3d *rpy)

{
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_70;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  dVar2 = cos((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0]);
  dVar3 = sin((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0]);
  dVar4 = cos((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1]);
  dVar5 = sin((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1]);
  dVar6 = cos((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2]);
  dVar7 = sin((rpy->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[2]);
  local_70.m_row = 0;
  local_70.m_col = 1;
  local_70.m_currentBlockRows = 1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = dVar4 * dVar6;
  local_18 = dVar4 * dVar7;
  local_70.m_xpr = __return_storage_ptr__;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (&local_70,&local_18);
  local_20 = -dVar5;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_20);
  local_28 = dVar3 * dVar5 * dVar6 - dVar7 * dVar2;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_28);
  local_30 = dVar3 * dVar5 * dVar7 + dVar2 * dVar6;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_30);
  local_38 = dVar3 * dVar4;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_38);
  local_40 = dVar5 * dVar2 * dVar6 + dVar3 * dVar7;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_40);
  local_48 = dVar5 * dVar2 * dVar7 - dVar6 * dVar3;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                     (pCVar1,&local_48);
  local_50 = dVar2 * dVar4;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar1,&local_50);
  if ((local_70.m_currentBlockRows + local_70.m_row == 3) && (local_70.m_col == 3)) {
    return __return_storage_ptr__;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
               );
}

Assistant:

Eigen::Matrix3d RPYToRotMat(const Eigen::Vector3d& rpy){

        Eigen::Matrix3d rot_I_to_B; // inertial frame to body frame
        double cr   = cos(rpy[0]);
        double sr   = sin(rpy[0]);
        double cp   = cos(rpy[1]);
        double sp   = sin(rpy[1]);
        double cy   = cos(rpy[2]);
        double sy   = sin(rpy[2]);

        rot_I_to_B << cp*cy, cp*sy, -sp,
                sr*sp*cy - cr*sy, sr*sp*sy + cr*cy, sr*cp,
                cr*sp*cy + sr*sy, cr*sp*sy - sr*cy, cr*cp;

        return rot_I_to_B;
    }